

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

void Luv32fromLuv48(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  uint *puVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  
  puVar4 = (uint *)sp->tbuf;
  if (sp->encode_meth == 0) {
    if (0 < n) {
      uVar3 = n + 1;
      do {
        *puVar4 = (uint)((short)*(ushort *)((long)op + 4) * 0x19a) >> 0xf & 0xff |
                  (uint)((short)*(ushort *)((long)op + 2) * 0x19a) >> 7 & 0xff00 |
                  (uint)*(ushort *)op << 0x10;
        puVar4 = puVar4 + 1;
        op = (uint8_t *)((long)op + 6);
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
  }
  else if (0 < n) {
    uVar3 = n + 1;
    do {
      uVar1 = *(ushort *)op;
      dVar6 = (double)(int)(short)*(ushort *)((long)op + 2) * 0.01251220703125;
      if (sp->encode_meth == 0) {
        bVar5 = true;
      }
      else {
        iVar2 = rand();
        dVar6 = (double)iVar2 * 4.656612875245797e-10 + dVar6 + -0.5;
        bVar5 = sp->encode_meth == 0;
      }
      dVar7 = (double)(int)(short)*(ushort *)((long)op + 4) * 0.01251220703125;
      if (!bVar5) {
        iVar2 = rand();
        dVar7 = (double)iVar2 * 4.656612875245797e-10 + dVar7 + -0.5;
      }
      *puVar4 = (int)dVar7 & 0xffU | ((int)dVar6 & 0xffU) << 8 | (uint)uVar1 << 0x10;
      puVar4 = puVar4 + 1;
      op = (uint8_t *)((long)op + 6);
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

static void Luv32fromLuv48(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    int16_t *luv3 = (int16_t *)op;

    if (sp->encode_meth == SGILOGENCODE_NODITHER)
    {
        while (n-- > 0)
        {
            *luv++ = (uint32_t)luv3[0] << 16 |
                     (luv3[1] * (uint32_t)(UVSCALE + .5) >> 7 & 0xff00) |
                     (luv3[2] * (uint32_t)(UVSCALE + .5) >> 15 & 0xff);
            luv3 += 3;
        }
        return;
    }
    while (n-- > 0)
    {
        *luv++ =
            (uint32_t)luv3[0] << 16 |
            (tiff_itrunc(luv3[1] * (UVSCALE / (1 << 15)), sp->encode_meth)
                 << 8 &
             0xff00) |
            (tiff_itrunc(luv3[2] * (UVSCALE / (1 << 15)), sp->encode_meth) &
             0xff);
        luv3 += 3;
    }
}